

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O0

string * __thiscall
llvm::utohexstr_abi_cxx11_(string *__return_storage_ptr__,llvm *this,uint64_t X,bool LowerCase)

{
  char cVar1;
  char *pcVar2;
  char *__end;
  allocator<char> local_42;
  byte local_41;
  char *pcStack_40;
  uchar Mod;
  char *BufPtr;
  char Buffer [17];
  llvm *plStack_18;
  bool LowerCase_local;
  uint64_t X_local;
  
  pcVar2 = std::end<char,17ul>((char (*) [17])&BufPtr);
  pcStack_40 = pcVar2;
  plStack_18 = this;
  if (this == (llvm *)0x0) {
    pcStack_40 = pcVar2 + -1;
    pcVar2[-1] = '0';
  }
  for (; pcVar2 = pcStack_40, plStack_18 != (llvm *)0x0;
      plStack_18 = (llvm *)((ulong)plStack_18 >> 4)) {
    local_41 = (byte)plStack_18 & 0xf;
    cVar1 = hexdigit((uint)local_41,(bool)((byte)X & 1));
    pcStack_40[-1] = cVar1;
    pcStack_40 = pcStack_40 + -1;
  }
  __end = std::end<char,17ul>((char (*) [17])&BufPtr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>((string *)__return_storage_ptr__,pcVar2,__end,&local_42);
  std::allocator<char>::~allocator(&local_42);
  return __return_storage_ptr__;
}

Assistant:

inline std::string utohexstr(uint64_t X, bool LowerCase = false) {
  char Buffer[17];
  char *BufPtr = std::end(Buffer);

  if (X == 0) *--BufPtr = '0';

  while (X) {
    unsigned char Mod = static_cast<unsigned char>(X) & 15;
    *--BufPtr = hexdigit(Mod, LowerCase);
    X >>= 4;
  }

  return std::string(BufPtr, std::end(Buffer));
}